

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

string * __thiscall
t_cpp_generator::type_to_enum_abi_cxx11_
          (string *__return_storage_ptr__,t_cpp_generator *this,t_type *type)

{
  int iVar1;
  t_type *ptVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var;
  undefined8 *puVar3;
  char *pcVar4;
  char *pcVar5;
  
  ptVar2 = t_type::get_true_type(type);
  iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[5])(ptVar2);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])(ptVar2);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xb])(ptVar2);
      if (((char)iVar1 == '\0') &&
         (iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xc])(ptVar2), (char)iVar1 == '\0')) {
        iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0x10])(ptVar2);
        if ((char)iVar1 == '\0') {
          iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xf])(ptVar2);
          if ((char)iVar1 == '\0') {
            iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xe])(ptVar2);
            if ((char)iVar1 == '\0') goto switchD_00187d4a_default;
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar5 = "::apache::thrift::protocol::T_LIST";
            pcVar4 = "";
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar5 = "::apache::thrift::protocol::T_SET";
            pcVar4 = "";
          }
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar5 = "::apache::thrift::protocol::T_MAP";
          pcVar4 = "";
        }
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "::apache::thrift::protocol::T_STRUCT";
        pcVar4 = "";
      }
      goto LAB_00187eb1;
    }
switchD_00187d4a_caseD_5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "::apache::thrift::protocol::T_I32";
    pcVar4 = "";
  }
  else {
    switch(*(undefined4 *)&ptVar2[1].super_t_doc._vptr_t_doc) {
    case 0:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "NO T_VOID CONSTRUCT";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    case 1:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "::apache::thrift::protocol::T_STRING";
      pcVar4 = "";
      break;
    case 2:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "::apache::thrift::protocol::T_BOOL";
      pcVar4 = "";
      break;
    case 3:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "::apache::thrift::protocol::T_BYTE";
      pcVar4 = "";
      break;
    case 4:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "::apache::thrift::protocol::T_I16";
      pcVar4 = "";
      break;
    case 5:
      goto switchD_00187d4a_caseD_5;
    case 6:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "::apache::thrift::protocol::T_I64";
      pcVar4 = "";
      break;
    case 7:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "::apache::thrift::protocol::T_DOUBLE";
      pcVar4 = "";
      break;
    default:
switchD_00187d4a_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[3])(ptVar2);
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_enum: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar1));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
LAB_00187eb1:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::type_to_enum(t_type* type) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "NO T_VOID CONSTRUCT";
    case t_base_type::TYPE_STRING:
      return "::apache::thrift::protocol::T_STRING";
    case t_base_type::TYPE_BOOL:
      return "::apache::thrift::protocol::T_BOOL";
    case t_base_type::TYPE_I8:
      return "::apache::thrift::protocol::T_BYTE";
    case t_base_type::TYPE_I16:
      return "::apache::thrift::protocol::T_I16";
    case t_base_type::TYPE_I32:
      return "::apache::thrift::protocol::T_I32";
    case t_base_type::TYPE_I64:
      return "::apache::thrift::protocol::T_I64";
    case t_base_type::TYPE_DOUBLE:
      return "::apache::thrift::protocol::T_DOUBLE";
    }
  } else if (type->is_enum()) {
    return "::apache::thrift::protocol::T_I32";
  } else if (type->is_struct()) {
    return "::apache::thrift::protocol::T_STRUCT";
  } else if (type->is_xception()) {
    return "::apache::thrift::protocol::T_STRUCT";
  } else if (type->is_map()) {
    return "::apache::thrift::protocol::T_MAP";
  } else if (type->is_set()) {
    return "::apache::thrift::protocol::T_SET";
  } else if (type->is_list()) {
    return "::apache::thrift::protocol::T_LIST";
  }

  throw "INVALID TYPE IN type_to_enum: " + type->get_name();
}